

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BezierCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BezierCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  unsigned_long uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined4 uVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  size_t local_178;
  size_t local_170;
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar22 = r->_begin;
  auVar39._8_4_ = 0x7f800000;
  auVar39._0_8_ = 0x7f8000007f800000;
  auVar39._12_4_ = 0x7f800000;
  auVar77 = ZEXT1664(auVar39);
  auVar30._8_4_ = 0xff800000;
  auVar30._0_8_ = 0xff800000ff800000;
  auVar30._12_4_ = 0xff800000;
  auVar76 = ZEXT1664(auVar30);
  local_178 = 0;
  auVar78._8_4_ = 0x7fffffff;
  auVar78._0_8_ = 0x7fffffff7fffffff;
  auVar78._12_4_ = 0x7fffffff;
  auVar82._8_4_ = 0x7fffffff;
  auVar82._0_8_ = 0x7fffffff7fffffff;
  auVar82._12_4_ = 0x7fffffff;
  auVar83._8_4_ = 0xddccb9a2;
  auVar83._0_8_ = 0xddccb9a2ddccb9a2;
  auVar83._12_4_ = 0xddccb9a2;
  auVar84._8_4_ = 0x5dccb9a2;
  auVar84._0_8_ = 0x5dccb9a25dccb9a2;
  auVar84._12_4_ = 0x5dccb9a2;
  auVar85 = ZEXT1664(auVar30);
  auVar86 = ZEXT1664(auVar39);
  local_170 = k;
  while( true ) {
    if (r->_end <= uVar22) {
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = auVar86._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = auVar85._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = auVar77._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = auVar76._0_16_;
      __return_storage_ptr__->end = local_178;
      return __return_storage_ptr__;
    }
    pBVar3 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.vertices
             .items;
    uVar2 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                super_CurveGeometry.super_Geometry.field_0x58 +
                     *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                               super_CurveGeometry.field_0x68 * uVar22);
    uVar24 = (ulong)uVar2;
    uVar19 = (ulong)(uVar2 + 3);
    if (uVar19 < (pBVar3->super_RawBufferView).num) break;
LAB_01c08c07:
    uVar22 = uVar22 + 1;
  }
  uVar28 = (ulong)(uVar2 + 1);
  uVar26 = (ulong)(uVar2 + 2);
  lVar25 = 0;
LAB_01c08820:
  bVar29 = (ulong)((this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                   super_Geometry.numTimeSteps - 1) * 0x38 + 0x70 == lVar25 + 0x38;
  if (bVar29) {
    pcVar4 = (pBVar3->super_RawBufferView).ptr_ofs;
    sVar5 = (pBVar3->super_RawBufferView).stride;
    auVar30 = *(undefined1 (*) [16])(pcVar4 + uVar24 * sVar5);
    auVar39 = *(undefined1 (*) [16])(pcVar4 + uVar28 * sVar5);
    auVar42 = *(undefined1 (*) [16])(pcVar4 + uVar26 * sVar5);
    auVar47 = *(undefined1 (*) [16])(pcVar4 + uVar19 * sVar5);
    fVar1 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
            maxRadiusScale;
    auVar31 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416(*(uint *)(pcVar4 + uVar24 * sVar5 + 0xc)))
    ;
    auVar32 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416(*(uint *)(pcVar4 + uVar28 * sVar5 + 0xc)))
    ;
    auVar33 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416(*(uint *)(pcVar4 + uVar26 * sVar5 + 0xc)))
    ;
    auVar34 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416(*(uint *)(pcVar4 + uVar19 * sVar5 + 0xc)))
    ;
    lVar25 = (long)(this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                   tessellationRate;
    if (lVar25 == 4) {
      auVar35 = vbroadcastss_avx512vl(auVar30);
      auVar36 = vshufps_avx512vl(auVar30,auVar30,0x55);
      auVar30 = vshufps_avx512vl(auVar30,auVar30,0xaa);
      auVar31 = vbroadcastss_avx512vl(auVar31);
      auVar37 = vbroadcastss_avx512vl(auVar39);
      auVar38 = vshufps_avx512vl(auVar39,auVar39,0x55);
      auVar39 = vshufps_avx512vl(auVar39,auVar39,0xaa);
      auVar32 = vbroadcastss_avx512vl(auVar32);
      auVar40 = vbroadcastss_avx512vl(auVar42);
      auVar41 = vshufps_avx512vl(auVar42,auVar42,0x55);
      auVar42 = vshufps_avx512vl(auVar42,auVar42,0xaa);
      auVar33 = vbroadcastss_avx512vl(auVar33);
      auVar43 = vbroadcastss_avx512vl(auVar47);
      auVar44 = vshufps_avx512vl(auVar47,auVar47,0x55);
      auVar45 = vshufps_avx512vl(auVar47,auVar47,0xaa);
      auVar46 = vbroadcastss_avx512vl(auVar34);
      auVar80._0_4_ = auVar43._0_4_ * (float)bezier_basis0._3740_4_;
      auVar80._4_4_ = auVar43._4_4_ * (float)bezier_basis0._3744_4_;
      auVar80._8_4_ = auVar43._8_4_ * (float)bezier_basis0._3748_4_;
      auVar80._12_4_ = auVar43._12_4_ * (float)bezier_basis0._3752_4_;
      auVar81._0_4_ = auVar44._0_4_ * (float)bezier_basis0._3740_4_;
      auVar81._4_4_ = auVar44._4_4_ * (float)bezier_basis0._3744_4_;
      auVar81._8_4_ = auVar44._8_4_ * (float)bezier_basis0._3748_4_;
      auVar81._12_4_ = auVar44._12_4_ * (float)bezier_basis0._3752_4_;
      auVar44._0_4_ = auVar45._0_4_ * (float)bezier_basis0._3740_4_;
      auVar44._4_4_ = auVar45._4_4_ * (float)bezier_basis0._3744_4_;
      auVar44._8_4_ = auVar45._8_4_ * (float)bezier_basis0._3748_4_;
      auVar44._12_4_ = auVar45._12_4_ * (float)bezier_basis0._3752_4_;
      auVar43._0_4_ = auVar46._0_4_ * (float)bezier_basis0._3740_4_;
      auVar43._4_4_ = auVar46._4_4_ * (float)bezier_basis0._3744_4_;
      auVar43._8_4_ = auVar46._8_4_ * (float)bezier_basis0._3748_4_;
      auVar43._12_4_ = auVar46._12_4_ * (float)bezier_basis0._3752_4_;
      auVar40 = vfmadd231ps_avx512vl(auVar80,bezier_basis0._2584_16_,auVar40);
      auVar41 = vfmadd231ps_avx512vl(auVar81,bezier_basis0._2584_16_,auVar41);
      auVar42 = vfmadd231ps_avx512vl(auVar44,bezier_basis0._2584_16_,auVar42);
      auVar33 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._2584_16_,auVar33);
      auVar37 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._1428_16_,auVar37);
      auVar38 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._1428_16_,auVar38);
      auVar39 = vfmadd231ps_avx512vl(auVar42,bezier_basis0._1428_16_,auVar39);
      auVar42 = vfmadd231ps_avx512vl(auVar33,bezier_basis0._1428_16_,auVar32);
      auVar33 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._272_16_,auVar35);
      auVar35 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._272_16_,auVar36);
      auVar36 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._272_16_,auVar30);
      auVar37 = vfmadd231ps_avx512vl(auVar42,bezier_basis0._272_16_,auVar31);
      auVar31 = vshufps_avx(auVar33,auVar33,0xb1);
      auVar30 = vminps_avx(auVar31,auVar33);
      auVar39 = vshufpd_avx(auVar30,auVar30,1);
      auVar30 = vminps_avx(auVar39,auVar30);
      auVar32 = vshufps_avx(auVar35,auVar35,0xb1);
      auVar39 = vminps_avx512vl(auVar32,auVar35);
      auVar42 = vshufpd_avx512vl(auVar39,auVar39,1);
      auVar39 = vminps_avx512vl(auVar42,auVar39);
      auVar30 = vinsertps_avx512f(auVar30,auVar39,0x1c);
      auVar38 = vshufps_avx512vl(auVar36,auVar36,0xb1);
      auVar39 = vminps_avx512vl(auVar38,auVar36);
      auVar42 = vshufpd_avx512vl(auVar39,auVar39,1);
      auVar39 = vminps_avx512vl(auVar42,auVar39);
      auVar42 = vinsertps_avx512f(auVar30,auVar39,0x20);
      auVar30 = vmaxps_avx(auVar31,auVar33);
      auVar39 = vshufpd_avx(auVar30,auVar30,1);
      auVar30 = vmaxps_avx(auVar39,auVar30);
      auVar39 = vmaxps_avx(auVar32,auVar35);
      auVar31 = vshufpd_avx(auVar39,auVar39,1);
      auVar39 = vmaxps_avx(auVar31,auVar39);
      auVar30 = vinsertps_avx(auVar30,auVar39,0x1c);
      auVar31 = vmaxps_avx512vl(auVar38,auVar36);
      auVar39 = vshufpd_avx(auVar31,auVar31,1);
      auVar39 = vmaxps_avx(auVar39,auVar31);
      auVar39 = vinsertps_avx512f(auVar30,auVar39,0x20);
      auVar30 = vandps_avx(auVar37,auVar78);
      auVar31 = vprolq_avx512vl(auVar30,0x20);
      auVar30 = vmaxps_avx(auVar31,auVar30);
      uVar79 = auVar30._0_4_;
      auVar31._4_4_ = uVar79;
      auVar31._0_4_ = uVar79;
      auVar31._8_4_ = uVar79;
      auVar31._12_4_ = uVar79;
      auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
      auVar30 = vmaxps_avx512vl(auVar30,auVar31);
    }
    else {
      auVar48 = vpbroadcastd_avx512vl();
      auVar49 = vbroadcastss_avx512vl(auVar30);
      auVar73._8_4_ = 1;
      auVar73._0_8_ = 0x100000001;
      auVar73._12_4_ = 1;
      auVar73._16_4_ = 1;
      auVar73._20_4_ = 1;
      auVar73._24_4_ = 1;
      auVar73._28_4_ = 1;
      auVar50 = vpermps_avx512vl(auVar73,ZEXT1632(auVar30));
      auVar75._8_4_ = 2;
      auVar75._0_8_ = 0x200000002;
      auVar75._12_4_ = 2;
      auVar75._16_4_ = 2;
      auVar75._20_4_ = 2;
      auVar75._24_4_ = 2;
      auVar75._28_4_ = 2;
      auVar51 = vpermps_avx512vl(auVar75,ZEXT1632(auVar30));
      auVar52 = vbroadcastss_avx512vl(auVar31);
      auVar53 = vbroadcastss_avx512vl(auVar39);
      auVar54 = vpermps_avx512vl(auVar73,ZEXT1632(auVar39));
      auVar55 = vpermps_avx512vl(auVar75,ZEXT1632(auVar39));
      auVar56 = vbroadcastss_avx512vl(auVar32);
      auVar57 = vbroadcastss_avx512vl(auVar42);
      auVar58 = vpermps_avx512vl(auVar73,ZEXT1632(auVar42));
      auVar59 = vpermps_avx512vl(auVar75,ZEXT1632(auVar42));
      auVar60 = vbroadcastss_avx512vl(auVar33);
      auVar61 = vbroadcastss_avx512vl(auVar47);
      auVar62 = vpermps_avx512vl(auVar73,ZEXT1632(auVar47));
      auVar63 = vpermps_avx512vl(auVar75,ZEXT1632(auVar47));
      auVar64 = vbroadcastss_avx512vl(auVar34);
      lVar20 = lVar25 * 0x44;
      auVar30 = vxorps_avx512vl(auVar42,auVar42);
      auVar88 = ZEXT1664(auVar30);
      lVar27 = 0;
      auVar65 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar74 = auVar65;
      auVar73 = auVar66;
      auVar75 = auVar65;
      auVar67 = auVar66;
      for (; auVar87 = auVar88._0_32_, lVar27 < lVar25; lVar27 = lVar27 + 8) {
        auVar68 = vpbroadcastd_avx512vl();
        auVar69 = vpor_avx2(auVar68,_DAT_01fb4ba0);
        auVar68 = *(undefined1 (*) [32])(lVar20 + 0x21fbbec + lVar27 * 4);
        auVar72 = *(undefined1 (*) [32])(lVar20 + 0x21fc070 + lVar27 * 4);
        uVar19 = vpcmpgtd_avx512vl(auVar48,auVar69);
        auVar69 = vmulps_avx512vl(auVar61,auVar72);
        auVar70 = vmulps_avx512vl(auVar62,auVar72);
        auVar71 = vmulps_avx512vl(auVar63,auVar72);
        auVar72 = vmulps_avx512vl(auVar64,auVar72);
        auVar30 = vfmadd231ps_fma(auVar69,auVar68,auVar57);
        auVar39 = vfmadd231ps_fma(auVar70,auVar68,auVar58);
        auVar69 = vfmadd231ps_avx512vl(auVar71,auVar68,auVar59);
        auVar72 = vfmadd231ps_avx512vl(auVar72,auVar60,auVar68);
        auVar68 = *(undefined1 (*) [32])(lVar20 + 0x21fb768 + lVar27 * 4);
        auVar30 = vfmadd231ps_fma(ZEXT1632(auVar30),auVar68,auVar53);
        auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar68,auVar54);
        auVar42 = vfmadd231ps_fma(auVar69,auVar68,auVar55);
        auVar31 = vfmadd231ps_fma(auVar72,auVar68,auVar56);
        auVar68 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 * 4 + lVar20);
        auVar30 = vfmadd231ps_fma(ZEXT1632(auVar30),auVar68,auVar49);
        auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar68,auVar50);
        auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar68,auVar51);
        auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),auVar68,auVar52);
        auVar72 = vminps_avx512vl(auVar73,ZEXT1632(auVar30));
        bVar6 = (byte)uVar19;
        auVar68._0_4_ = (uint)(bVar6 & 1) * auVar72._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar73._0_4_
        ;
        bVar29 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar68._4_4_ = (uint)bVar29 * auVar72._4_4_ | (uint)!bVar29 * auVar73._4_4_;
        bVar29 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar68._8_4_ = (uint)bVar29 * auVar72._8_4_ | (uint)!bVar29 * auVar73._8_4_;
        bVar29 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar68._12_4_ = (uint)bVar29 * auVar72._12_4_ | (uint)!bVar29 * auVar73._12_4_;
        bVar29 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar68._16_4_ = (uint)bVar29 * auVar72._16_4_ | (uint)!bVar29 * auVar73._16_4_;
        bVar29 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar68._20_4_ = (uint)bVar29 * auVar72._20_4_ | (uint)!bVar29 * auVar73._20_4_;
        bVar29 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar68._24_4_ = (uint)bVar29 * auVar72._24_4_ | (uint)!bVar29 * auVar73._24_4_;
        bVar29 = SUB81(uVar19 >> 7,0);
        auVar68._28_4_ = (uint)bVar29 * auVar72._28_4_ | (uint)!bVar29 * auVar73._28_4_;
        auVar73 = vmaxps_avx512vl(auVar75,ZEXT1632(auVar30));
        auVar72._0_4_ = (uint)(bVar6 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar75._0_4_
        ;
        bVar29 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar72._4_4_ = (uint)bVar29 * auVar73._4_4_ | (uint)!bVar29 * auVar75._4_4_;
        bVar29 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar72._8_4_ = (uint)bVar29 * auVar73._8_4_ | (uint)!bVar29 * auVar75._8_4_;
        bVar29 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar72._12_4_ = (uint)bVar29 * auVar73._12_4_ | (uint)!bVar29 * auVar75._12_4_;
        bVar29 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar72._16_4_ = (uint)bVar29 * auVar73._16_4_ | (uint)!bVar29 * auVar75._16_4_;
        bVar29 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar72._20_4_ = (uint)bVar29 * auVar73._20_4_ | (uint)!bVar29 * auVar75._20_4_;
        bVar29 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar72._24_4_ = (uint)bVar29 * auVar73._24_4_ | (uint)!bVar29 * auVar75._24_4_;
        bVar29 = SUB81(uVar19 >> 7,0);
        auVar72._28_4_ = (uint)bVar29 * auVar73._28_4_ | (uint)!bVar29 * auVar75._28_4_;
        auVar73 = vminps_avx512vl(auVar66,ZEXT1632(auVar39));
        auVar69._0_4_ = (uint)(bVar6 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar66._0_4_
        ;
        bVar29 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar69._4_4_ = (uint)bVar29 * auVar73._4_4_ | (uint)!bVar29 * auVar66._4_4_;
        bVar29 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar69._8_4_ = (uint)bVar29 * auVar73._8_4_ | (uint)!bVar29 * auVar66._8_4_;
        bVar29 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar69._12_4_ = (uint)bVar29 * auVar73._12_4_ | (uint)!bVar29 * auVar66._12_4_;
        bVar29 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar69._16_4_ = (uint)bVar29 * auVar73._16_4_ | (uint)!bVar29 * auVar66._16_4_;
        bVar29 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar69._20_4_ = (uint)bVar29 * auVar73._20_4_ | (uint)!bVar29 * auVar66._20_4_;
        bVar29 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar69._24_4_ = (uint)bVar29 * auVar73._24_4_ | (uint)!bVar29 * auVar66._24_4_;
        bVar29 = SUB81(uVar19 >> 7,0);
        auVar69._28_4_ = (uint)bVar29 * auVar73._28_4_ | (uint)!bVar29 * auVar66._28_4_;
        auVar73 = vmaxps_avx512vl(auVar74,ZEXT1632(auVar39));
        auVar66._0_4_ = (uint)(bVar6 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar74._0_4_
        ;
        bVar29 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar66._4_4_ = (uint)bVar29 * auVar73._4_4_ | (uint)!bVar29 * auVar74._4_4_;
        bVar29 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar66._8_4_ = (uint)bVar29 * auVar73._8_4_ | (uint)!bVar29 * auVar74._8_4_;
        bVar29 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar66._12_4_ = (uint)bVar29 * auVar73._12_4_ | (uint)!bVar29 * auVar74._12_4_;
        bVar29 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar66._16_4_ = (uint)bVar29 * auVar73._16_4_ | (uint)!bVar29 * auVar74._16_4_;
        bVar29 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar66._20_4_ = (uint)bVar29 * auVar73._20_4_ | (uint)!bVar29 * auVar74._20_4_;
        bVar29 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar66._24_4_ = (uint)bVar29 * auVar73._24_4_ | (uint)!bVar29 * auVar74._24_4_;
        bVar29 = SUB81(uVar19 >> 7,0);
        auVar66._28_4_ = (uint)bVar29 * auVar73._28_4_ | (uint)!bVar29 * auVar74._28_4_;
        auVar73 = vminps_avx512vl(auVar67,ZEXT1632(auVar42));
        auVar70._0_4_ = (uint)(bVar6 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar67._0_4_
        ;
        bVar29 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar70._4_4_ = (uint)bVar29 * auVar73._4_4_ | (uint)!bVar29 * auVar67._4_4_;
        bVar29 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar70._8_4_ = (uint)bVar29 * auVar73._8_4_ | (uint)!bVar29 * auVar67._8_4_;
        bVar29 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar70._12_4_ = (uint)bVar29 * auVar73._12_4_ | (uint)!bVar29 * auVar67._12_4_;
        bVar29 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar70._16_4_ = (uint)bVar29 * auVar73._16_4_ | (uint)!bVar29 * auVar67._16_4_;
        bVar29 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar70._20_4_ = (uint)bVar29 * auVar73._20_4_ | (uint)!bVar29 * auVar67._20_4_;
        bVar29 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar70._24_4_ = (uint)bVar29 * auVar73._24_4_ | (uint)!bVar29 * auVar67._24_4_;
        bVar29 = SUB81(uVar19 >> 7,0);
        auVar70._28_4_ = (uint)bVar29 * auVar73._28_4_ | (uint)!bVar29 * auVar67._28_4_;
        auVar73 = vmaxps_avx512vl(auVar65,ZEXT1632(auVar42));
        auVar74._0_4_ = (uint)(bVar6 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar65._0_4_
        ;
        bVar29 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar74._4_4_ = (uint)bVar29 * auVar73._4_4_ | (uint)!bVar29 * auVar65._4_4_;
        bVar29 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar74._8_4_ = (uint)bVar29 * auVar73._8_4_ | (uint)!bVar29 * auVar65._8_4_;
        bVar29 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar74._12_4_ = (uint)bVar29 * auVar73._12_4_ | (uint)!bVar29 * auVar65._12_4_;
        bVar29 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar74._16_4_ = (uint)bVar29 * auVar73._16_4_ | (uint)!bVar29 * auVar65._16_4_;
        bVar29 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar74._20_4_ = (uint)bVar29 * auVar73._20_4_ | (uint)!bVar29 * auVar65._20_4_;
        bVar29 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar74._24_4_ = (uint)bVar29 * auVar73._24_4_ | (uint)!bVar29 * auVar65._24_4_;
        bVar29 = SUB81(uVar19 >> 7,0);
        auVar74._28_4_ = (uint)bVar29 * auVar73._28_4_ | (uint)!bVar29 * auVar65._28_4_;
        auVar65._8_4_ = 0x7fffffff;
        auVar65._0_8_ = 0x7fffffff7fffffff;
        auVar65._12_4_ = 0x7fffffff;
        auVar65._16_4_ = 0x7fffffff;
        auVar65._20_4_ = 0x7fffffff;
        auVar65._24_4_ = 0x7fffffff;
        auVar65._28_4_ = 0x7fffffff;
        vandps_avx512vl(ZEXT1632(auVar31),auVar65);
        auVar73 = vmaxps_avx512vl(auVar87,auVar74);
        bVar29 = (bool)((byte)(uVar19 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar19 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar19 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar19 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar19 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar19 >> 6) & 1);
        bVar12 = SUB81(uVar19 >> 7,0);
        auVar88 = ZEXT3264(CONCAT428((uint)bVar12 * auVar73._28_4_ | (uint)!bVar12 * auVar88._28_4_,
                                     CONCAT424((uint)bVar11 * auVar73._24_4_ |
                                               (uint)!bVar11 * auVar88._24_4_,
                                               CONCAT420((uint)bVar10 * auVar73._20_4_ |
                                                         (uint)!bVar10 * auVar88._20_4_,
                                                         CONCAT416((uint)bVar9 * auVar73._16_4_ |
                                                                   (uint)!bVar9 * auVar88._16_4_,
                                                                   CONCAT412((uint)bVar8 *
                                                                             auVar73._12_4_ |
                                                                             (uint)!bVar8 *
                                                                             auVar88._12_4_,
                                                                             CONCAT48((uint)bVar7 *
                                                                                      auVar73._8_4_
                                                                                      | (uint)!bVar7
                                                                                        * auVar88.
                                                  _8_4_,CONCAT44((uint)bVar29 * auVar73._4_4_ |
                                                                 (uint)!bVar29 * auVar88._4_4_,
                                                                 (uint)(bVar6 & 1) * auVar73._0_4_ |
                                                                 (uint)!(bool)(bVar6 & 1) *
                                                                 auVar88._0_4_))))))));
        auVar65 = auVar74;
        auVar74 = auVar66;
        auVar66 = auVar69;
        auVar73 = auVar68;
        auVar75 = auVar72;
        auVar67 = auVar70;
      }
      auVar48 = vshufps_avx512vl(auVar73,auVar73,0xb1);
      auVar48 = vminps_avx512vl(auVar73,auVar48);
      auVar73 = vshufpd_avx(auVar48,auVar48,5);
      auVar73 = vminps_avx(auVar48,auVar73);
      auVar30 = vminps_avx(auVar73._0_16_,auVar73._16_16_);
      auVar73 = vshufps_avx512vl(auVar66,auVar66,0xb1);
      auVar66 = vminps_avx512vl(auVar66,auVar73);
      auVar73 = vshufpd_avx(auVar66,auVar66,5);
      auVar73 = vminps_avx(auVar66,auVar73);
      auVar39 = vminps_avx(auVar73._0_16_,auVar73._16_16_);
      auVar39 = vunpcklps_avx(auVar30,auVar39);
      auVar73 = vshufps_avx512vl(auVar67,auVar67,0xb1);
      auVar66 = vminps_avx512vl(auVar67,auVar73);
      auVar73 = vshufpd_avx(auVar66,auVar66,5);
      auVar73 = vminps_avx(auVar66,auVar73);
      auVar30 = vminps_avx(auVar73._0_16_,auVar73._16_16_);
      auVar42 = vinsertps_avx512f(auVar39,auVar30,0x28);
      auVar73 = vshufps_avx512vl(auVar75,auVar75,0xb1);
      auVar75 = vmaxps_avx512vl(auVar75,auVar73);
      auVar73 = vshufpd_avx(auVar75,auVar75,5);
      auVar73 = vmaxps_avx(auVar75,auVar73);
      auVar30 = vmaxps_avx(auVar73._0_16_,auVar73._16_16_);
      auVar73 = vshufps_avx512vl(auVar74,auVar74,0xb1);
      auVar75 = vmaxps_avx512vl(auVar74,auVar73);
      auVar73 = vshufpd_avx(auVar75,auVar75,5);
      auVar73 = vmaxps_avx(auVar75,auVar73);
      auVar39 = vmaxps_avx(auVar73._0_16_,auVar73._16_16_);
      auVar39 = vunpcklps_avx(auVar30,auVar39);
      auVar73 = vshufps_avx512vl(auVar65,auVar65,0xb1);
      auVar75 = vmaxps_avx512vl(auVar65,auVar73);
      auVar73 = vshufpd_avx(auVar75,auVar75,5);
      auVar73 = vmaxps_avx(auVar75,auVar73);
      auVar30 = vmaxps_avx(auVar73._0_16_,auVar73._16_16_);
      auVar39 = vinsertps_avx512f(auVar39,auVar30,0x28);
      auVar73 = vshufps_avx512vl(auVar87,auVar87,0xb1);
      auVar75 = vmaxps_avx512vl(auVar87,auVar73);
      auVar73 = vshufpd_avx(auVar75,auVar75,5);
      auVar73 = vmaxps_avx(auVar75,auVar73);
      auVar30 = vmaxps_avx(auVar73._0_16_,auVar73._16_16_);
      auVar30 = vbroadcastss_avx512vl(auVar30);
    }
    auVar47 = vinsertps_avx512f(auVar47,auVar34,0x30);
    auVar42 = vminps_avx512vl(auVar42,auVar47);
    auVar47 = vmaxps_avx512vl(auVar39,auVar47);
    auVar39 = vbroadcastss_avx512vl(auVar34);
    auVar39 = vandps_avx(auVar39,auVar78);
    auVar30 = vmaxps_avx512vl(auVar30,auVar39);
    auVar42 = vsubps_avx(auVar42,auVar30);
    auVar32._0_4_ = auVar47._0_4_ + auVar30._0_4_;
    auVar32._4_4_ = auVar47._4_4_ + auVar30._4_4_;
    auVar32._8_4_ = auVar47._8_4_ + auVar30._8_4_;
    auVar32._12_4_ = auVar47._12_4_ + auVar30._12_4_;
    auVar30 = vandps_avx(auVar42,auVar78);
    auVar39 = vandps_avx(auVar32,auVar78);
    auVar30 = vmaxps_avx(auVar30,auVar39);
    auVar39 = vmovshdup_avx(auVar30);
    auVar39 = vmaxss_avx(auVar39,auVar30);
    auVar30 = vshufpd_avx(auVar30,auVar30,1);
    auVar30 = vmaxss_avx(auVar30,auVar39);
    fVar1 = auVar30._0_4_ * 4.7683716e-07;
    auVar47._4_4_ = fVar1;
    auVar47._0_4_ = fVar1;
    auVar47._8_4_ = fVar1;
    auVar47._12_4_ = fVar1;
    auVar30 = vsubps_avx(auVar42,auVar47);
    aVar13 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar30,ZEXT416(geomID),0x30);
    auVar42._0_4_ = auVar32._0_4_ + fVar1;
    auVar42._4_4_ = auVar32._4_4_ + fVar1;
    auVar42._8_4_ = auVar32._8_4_ + fVar1;
    auVar42._12_4_ = auVar32._12_4_ + fVar1;
    aVar14 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar42,ZEXT416((uint)uVar22),0x30);
    auVar30 = vminps_avx512vl((undefined1  [16])auVar86._0_16_,(undefined1  [16])aVar13);
    auVar86 = ZEXT1664(auVar30);
    auVar30 = vmaxps_avx((undefined1  [16])auVar85._0_16_,(undefined1  [16])aVar14);
    auVar85 = ZEXT1664(auVar30);
    auVar33._0_4_ = aVar13.x + aVar14.x;
    auVar33._4_4_ = aVar13.y + aVar14.y;
    auVar33._8_4_ = aVar13.z + aVar14.z;
    auVar33._12_4_ = aVar13.field_3.w + aVar14.field_3.w;
    auVar30 = vminps_avx((undefined1  [16])auVar77._0_16_,auVar33);
    auVar77 = ZEXT1664(auVar30);
    auVar30 = vmaxps_avx((undefined1  [16])auVar76._0_16_,auVar33);
    auVar76 = ZEXT1664(auVar30);
    local_178 = local_178 + 1;
    prims[local_170].upper.field_0.field_1 = aVar14;
    prims[local_170].lower.field_0.field_1 = aVar13;
    local_170 = local_170 + 1;
  }
  else {
    lVar20 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar25);
    lVar27 = *(long *)((long)&(pBVar3->super_RawBufferView).stride + lVar25);
    lVar23 = lVar27 * uVar24;
    auVar30 = vandps_avx512vl(ZEXT416(*(uint *)(lVar20 + 0xc + lVar23)),auVar82);
    vucomiss_avx512f(auVar30);
    if (SEXT816(lVar23) == SEXT816(lVar27) * SEXT816((long)uVar24) && !bVar29) {
      lVar18 = lVar27 * uVar28;
      auVar30 = vandps_avx512vl(ZEXT416(*(uint *)(lVar20 + 0xc + lVar18)),auVar82);
      vucomiss_avx512f(auVar30);
      if (SEXT816(lVar18) == SEXT816(lVar27) * SEXT816((long)uVar28) && !bVar29) {
        lVar21 = lVar27 * uVar26;
        auVar30 = vandps_avx512vl(ZEXT416(*(uint *)(lVar20 + 0xc + lVar21)),auVar82);
        vucomiss_avx512f(auVar30);
        if (SEXT816(lVar21) == SEXT816(lVar27) * SEXT816((long)uVar26) && !bVar29) {
          lVar17 = lVar27 * uVar19;
          auVar30 = vandps_avx512vl(ZEXT416(*(uint *)(lVar20 + 0xc + lVar17)),auVar82);
          vucomiss_avx512f(auVar30);
          if (SEXT816(lVar17) == SEXT816(lVar27) * SEXT816((long)uVar19) && !bVar29) {
            uVar15 = vcmpps_avx512vl(*(undefined1 (*) [16])(lVar20 + lVar23),auVar83,6);
            uVar16 = vcmpps_avx512vl(*(undefined1 (*) [16])(lVar20 + lVar23),auVar84,1);
            if ((~((ushort)uVar15 & (ushort)uVar16) & 7) == 0) {
              uVar15 = vcmpps_avx512vl(*(undefined1 (*) [16])(lVar20 + lVar18),auVar83,6);
              uVar16 = vcmpps_avx512vl(*(undefined1 (*) [16])(lVar20 + lVar18),auVar84,1);
              if ((~((ushort)uVar15 & (ushort)uVar16) & 7) == 0) {
                uVar15 = vcmpps_avx512vl(*(undefined1 (*) [16])(lVar20 + lVar21),auVar83,6);
                uVar16 = vcmpps_avx512vl(*(undefined1 (*) [16])(lVar20 + lVar21),auVar84,1);
                if ((~((ushort)uVar15 & (ushort)uVar16) & 7) == 0) goto code_r0x01c0892a;
              }
            }
          }
        }
      }
    }
  }
  goto LAB_01c08c07;
code_r0x01c0892a:
  uVar15 = vcmpps_avx512vl(*(undefined1 (*) [16])(lVar20 + lVar17),auVar83,6);
  uVar16 = vcmpps_avx512vl(*(undefined1 (*) [16])(lVar20 + lVar17),auVar84,1);
  lVar25 = lVar25 + 0x38;
  if ((~((ushort)uVar15 & (ushort)uVar16) & 7) != 0) goto LAB_01c08c07;
  goto LAB_01c08820;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }